

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

bool CheckHostPortOptions(ArgsManager *args)

{
  long lVar1;
  pointer pbVar2;
  pointer pbVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  bool bVar5;
  long lVar6;
  _Alloc_hider strArg;
  long in_FS_OFFSET;
  string_view str;
  string_view in;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  __l;
  basic_string_view<char,_std::char_traits<char>_> __x;
  byte local_269;
  allocator_type local_253;
  bool local_252;
  bool local_251;
  bool local_250;
  bool local_24f;
  bool local_24e;
  bool local_24d;
  bool local_24c;
  bool local_24b;
  uint16_t n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_230 [80];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_1e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_1b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_190;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_140;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_a0;
  string port;
  string port_option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x684075;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x68407b;
  lVar6 = 0;
  while (lVar6 != 0x10) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&port_option,
               *(char **)((long)&local_248.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6),
               (allocator<char> *)local_230);
    bVar4 = ArgsManager::IsArgSet(args,&port_option);
    bVar5 = true;
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_230,"",(allocator<char> *)&n);
      ArgsManager::GetArg(&port,args,&port_option,(string *)local_230);
      std::__cxx11::string::~string((string *)local_230);
      str._M_str = port._M_dataplus._M_p;
      str._M_len = port._M_string_length;
      bVar4 = ParseUInt16(str,&n);
      bVar5 = bVar4 && n != 0;
      if (!bVar4 || n == 0) {
        common::InvalidPortErrMsg((bilingual_str *)local_230,&port_option,&port);
        local_269 = InitError((bilingual_str *)local_230);
        bilingual_str::~bilingual_str((bilingual_str *)local_230);
      }
      std::__cxx11::string::~string((string *)&port);
    }
    std::__cxx11::string::~string((string *)&port_option);
    lVar6 = lVar6 + 8;
    if (!bVar5) goto LAB_00157c6e;
  }
  port_option._M_dataplus._M_p = port_option._M_dataplus._M_p & 0xffffffffffffff00;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[8],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)local_230,(char (*) [8])"-i2psam",(bool *)&port_option);
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_248.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,1);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[7],_bool,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
              *)(local_230 + 0x28),(char (*) [7])"-onion",(bool *)&local_248);
  n = CONCAT11(n._1_1_,1);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[7],_bool,_true>(&local_1e0,(char (*) [7])"-proxy",(bool *)&n);
  local_24b = false;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[9],_bool,_true>(&local_1b8,(char (*) [9])"-rpcbind",&local_24b);
  local_24c = false;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[12],_bool,_true>(&local_190,(char (*) [12])"-torcontrol",&local_24c);
  local_24d = false;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[11],_bool,_true>(&local_168,(char (*) [11])"-whitebind",&local_24d);
  local_24e = true;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[17],_bool,_true>(&local_140,(char (*) [17])"-zmqpubhashblock",&local_24e);
  local_24f = true;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[14],_bool,_true>(&local_118,(char (*) [14])"-zmqpubhashtx",&local_24f);
  local_250 = true;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[16],_bool,_true>(&local_f0,(char (*) [16])"-zmqpubrawblock",&local_250);
  local_251 = true;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[13],_bool,_true>(&local_c8,(char (*) [13])"-zmqpubrawtx",&local_251);
  local_252 = true;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>::
  pair<const_char_(&)[16],_bool,_true>(&local_a0,(char (*) [16])"-zmqpubsequence",&local_252);
  __l._M_len = 0xb;
  __l._M_array = (iterator)local_230;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
            *)&port,__l,&local_253);
  lVar6 = 400;
  do {
    std::__cxx11::string::~string((string *)(local_230 + lVar6));
    lVar6 = lVar6 + -0x28;
  } while (lVar6 != -0x28);
  strArg = port._M_dataplus;
  do {
    if (strArg._M_p == (pointer)port._M_string_length) {
      local_269 = 1;
      break;
    }
    ArgsManager::GetArgs(&local_248,args,(string *)strArg._M_p);
    pbVar2 = local_248.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = local_248.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      this = pbVar3;
      if (this == pbVar2) break;
      port_option._M_dataplus._M_p = (pointer)&port_option.field_2;
      port_option._M_string_length = 0;
      n = 0;
      port_option.field_2._M_local_buf[0] = '\0';
      in._M_str = (this->_M_dataplus)._M_p;
      in._M_len = this->_M_string_length;
      bVar4 = SplitHostPort(in,&n,&port_option);
      bVar5 = true;
      if ((!bVar4) &&
         ((*(char *)&(((string *)((long)strArg._M_p + 0x20))->_M_dataplus)._M_p != '\x01' ||
          (__x._M_str = ADDR_PREFIX_UNIX_abi_cxx11_._M_dataplus._M_p,
          __x._M_len = ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length,
          bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  starts_with(this,__x), !bVar4)))) {
        common::InvalidPortErrMsg((bilingual_str *)local_230,(string *)strArg._M_p,this);
        local_269 = InitError((bilingual_str *)local_230);
        bilingual_str::~bilingual_str((bilingual_str *)local_230);
        bVar5 = false;
      }
      std::__cxx11::string::~string((string *)&port_option);
      pbVar3 = this + 1;
    } while (bVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
    strArg._M_p = (pointer)&((string *)((long)strArg._M_p + 0x20))->_M_string_length;
  } while (this == pbVar2);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             *)&port);
LAB_00157c6e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(local_269 & 1);
}

Assistant:

bool CheckHostPortOptions(const ArgsManager& args) {
    for (const std::string port_option : {
        "-port",
        "-rpcport",
    }) {
        if (args.IsArgSet(port_option)) {
            const std::string port = args.GetArg(port_option, "");
            uint16_t n;
            if (!ParseUInt16(port, &n) || n == 0) {
                return InitError(InvalidPortErrMsg(port_option, port));
            }
        }
    }

    for ([[maybe_unused]] const auto& [arg, unix] : std::vector<std::pair<std::string, bool>>{
        // arg name            UNIX socket support
        {"-i2psam",                 false},
        {"-onion",                  true},
        {"-proxy",                  true},
        {"-rpcbind",                false},
        {"-torcontrol",             false},
        {"-whitebind",              false},
        {"-zmqpubhashblock",        true},
        {"-zmqpubhashtx",           true},
        {"-zmqpubrawblock",         true},
        {"-zmqpubrawtx",            true},
        {"-zmqpubsequence",         true},
    }) {
        for (const std::string& socket_addr : args.GetArgs(arg)) {
            std::string host_out;
            uint16_t port_out{0};
            if (!SplitHostPort(socket_addr, port_out, host_out)) {
#ifdef HAVE_SOCKADDR_UN
                // Allow unix domain sockets for some options e.g. unix:/some/file/path
                if (!unix || !socket_addr.starts_with(ADDR_PREFIX_UNIX)) {
                    return InitError(InvalidPortErrMsg(arg, socket_addr));
                }
#else
                return InitError(InvalidPortErrMsg(arg, socket_addr));
#endif
            }
        }
    }

    return true;
}